

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathCompileExpr(xmlXPathParserContextPtr ctxt,int sort)

{
  int ch1;
  xmlXPathContextPtr pxVar1;
  bool bVar2;
  int op1;
  xmlXPathContextPtr xpctxt;
  int sort_local;
  xmlXPathParserContextPtr ctxt_local;
  
  pxVar1 = ctxt->context;
  if (pxVar1 != (xmlXPathContextPtr)0x0) {
    if (4999 < pxVar1->depth) {
      xmlXPathErr(ctxt,0x1a);
      return;
    }
    pxVar1->depth = pxVar1->depth + 10;
  }
  xmlXPathCompAndExpr(ctxt);
  if (ctxt->error == 0) {
    while( true ) {
      bVar2 = true;
      if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
        bVar2 = *ctxt->cur == '\r';
      }
      if (!bVar2) break;
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    while( true ) {
      bVar2 = false;
      if (*ctxt->cur == 'o') {
        bVar2 = ctxt->cur[1] == 'r';
      }
      if (!bVar2) break;
      ch1 = ctxt->comp->last;
      ctxt->cur = ctxt->cur + 2;
      while( true ) {
        bVar2 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
          bVar2 = *ctxt->cur == '\r';
        }
        if (!bVar2) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      xmlXPathCompAndExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_OR,0,0,0,(void *)0x0,(void *)0x0);
      while( true ) {
        bVar2 = true;
        if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar2 = true, 10 < *ctxt->cur)))) {
          bVar2 = *ctxt->cur == '\r';
        }
        if (!bVar2) break;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
    }
    if ((sort != 0) && (ctxt->comp->steps[ctxt->comp->last].op != XPATH_OP_VALUE)) {
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_SORT,0,0,0,(void *)0x0,(void *)0x0);
    }
    if (pxVar1 != (xmlXPathContextPtr)0x0) {
      pxVar1->depth = pxVar1->depth + -10;
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompileExpr(xmlXPathParserContextPtr ctxt, int sort) {
    xmlXPathContextPtr xpctxt = ctxt->context;

    if (xpctxt != NULL) {
        if (xpctxt->depth >= XPATH_MAX_RECURSION_DEPTH)
            XP_ERROR(XPATH_RECURSION_LIMIT_EXCEEDED);
        /*
         * Parsing a single '(' pushes about 10 functions on the call stack
         * before recursing!
         */
        xpctxt->depth += 10;
    }

    xmlXPathCompAndExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == 'o') && (NXT(1) == 'r')) {
	int op1 = ctxt->comp->last;
        SKIP(2);
	SKIP_BLANKS;
        xmlXPathCompAndExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_OR, op1, ctxt->comp->last, 0, 0);
	SKIP_BLANKS;
    }
    if ((sort) && (ctxt->comp->steps[ctxt->comp->last].op != XPATH_OP_VALUE)) {
	/* more ops could be optimized too */
	/*
	* This is the main place to eliminate sorting for
	* operations which don't require a sorted node-set.
	* E.g. count().
	*/
	PUSH_UNARY_EXPR(XPATH_OP_SORT, ctxt->comp->last , 0, 0);
    }

    if (xpctxt != NULL)
        xpctxt->depth -= 10;
}